

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_edit.cc
# Opt level: O3

Status __thiscall leveldb::VersionEdit::DecodeFrom(VersionEdit *this,Slice *src)

{
  bool bVar1;
  char *pcVar2;
  undefined8 *in_RDX;
  VersionEdit *pVVar3;
  _Alloc_hider _Var4;
  int level;
  uint32_t tag;
  Status *result;
  InternalKey key;
  Slice str;
  uint64_t number;
  uint32_t v;
  FileMetaData f;
  Slice input;
  uint local_198;
  uint32_t local_194;
  VersionEdit *local_190;
  Slice *local_188;
  vector<std::pair<int,leveldb::InternalKey>,std::allocator<std::pair<int,leveldb::InternalKey>>>
  *local_180;
  Slice *local_178;
  size_t *local_170;
  Slice *local_168;
  size_t *local_160;
  Slice *local_158;
  _Alloc_hider local_150;
  InternalKey local_148;
  Slice local_128;
  char *local_118;
  undefined1 local_110 [8];
  char *local_108;
  char local_100 [8];
  char local_f8 [8];
  _Alloc_hider local_f0;
  char local_e0 [16];
  _Alloc_hider local_d0;
  char local_c0 [16];
  FileMetaData local_b0;
  Slice local_58;
  Slice local_40;
  
  src->size_ = 0;
  *src->data_ = '\0';
  local_158 = src + 2;
  local_178 = src + 6;
  *(undefined8 *)((long)&src[3].size_ + 5) = 0;
  src[3].data_ = (char *)0x0;
  src[3].size_ = 0;
  src[2].data_ = (char *)0x0;
  src[2].size_ = 0;
  local_190 = this;
  std::
  _Rb_tree<std::pair<int,_unsigned_long>,_std::pair<int,_unsigned_long>,_std::_Identity<std::pair<int,_unsigned_long>_>,_std::less<std::pair<int,_unsigned_long>_>,_std::allocator<std::pair<int,_unsigned_long>_>_>
  ::clear((_Rb_tree<std::pair<int,_unsigned_long>,_std::pair<int,_unsigned_long>,_std::_Identity<std::pair<int,_unsigned_long>_>,_std::less<std::pair<int,_unsigned_long>_>,_std::allocator<std::pair<int,_unsigned_long>_>_>
           *)local_178);
  local_188 = src + 9;
  std::
  vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
  ::_M_erase_at_end((vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                     *)local_188,(pointer)src[9].data_);
  local_58.data_ = (char *)*in_RDX;
  local_58.size_ = in_RDX[1];
  local_b0.refs = 0;
  local_b0.allowed_seeks = 0x40000000;
  local_b0.file_size = 0;
  local_b0.smallest.rep_._M_dataplus._M_p = (pointer)&local_b0.smallest.rep_.field_2;
  local_b0.smallest.rep_._M_string_length = 0;
  local_b0.smallest.rep_.field_2._M_local_buf[0] = '\0';
  local_b0.largest.rep_._M_dataplus._M_p = (pointer)&local_b0.largest.rep_.field_2;
  local_b0.largest.rep_._M_string_length = 0;
  local_b0.largest.rep_.field_2._M_local_buf[0] = '\0';
  local_128.data_ = "";
  local_128.size_ = 0;
  local_148.rep_._M_dataplus._M_p = (pointer)&local_148.rep_.field_2;
  local_148.rep_._M_string_length = 0;
  local_148.rep_.field_2._M_local_buf[0] = '\0';
  local_180 = (vector<std::pair<int,leveldb::InternalKey>,std::allocator<std::pair<int,leveldb::InternalKey>>>
               *)&src[4].size_;
  local_160 = &src[3].size_;
  local_168 = src + 3;
  local_170 = &src[2].size_;
  do {
    bVar1 = GetVarint32(&local_58,&local_194);
    if (!bVar1) {
      if (local_58.size_ == 0) {
        (local_190->comparator_)._M_dataplus._M_p = (pointer)0x0;
        pVVar3 = local_190;
      }
      else {
        local_40.data_ = "invalid tag";
LAB_00113a77:
        pVVar3 = local_190;
        (local_190->comparator_)._M_dataplus._M_p = (pointer)0x0;
        local_110 = (undefined1  [8])0x1262ed;
        local_108 = (char *)0xb;
        local_40.size_ = strlen(local_40.data_);
        Status::Status((Status *)&local_150,kCorruption,(Slice *)local_110,&local_40);
        (pVVar3->comparator_)._M_dataplus._M_p = local_150._M_p;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148.rep_._M_dataplus._M_p != &local_148.rep_.field_2) {
        operator_delete(local_148.rep_._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0.largest.rep_._M_dataplus._M_p != &local_b0.largest.rep_.field_2) {
        operator_delete(local_b0.largest.rep_._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0.smallest.rep_._M_dataplus._M_p != &local_b0.smallest.rep_.field_2) {
        operator_delete(local_b0.smallest.rep_._M_dataplus._M_p);
      }
      return (Status)(char *)pVVar3;
    }
    switch(local_194) {
    case 1:
      bVar1 = GetLengthPrefixedSlice(&local_58,&local_128);
      if (!bVar1) {
        local_40.data_ = "comparator name";
        goto LAB_00113a77;
      }
      local_110 = (undefined1  [8])local_100;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_110,local_128.data_,local_128.data_ + local_128.size_);
      std::__cxx11::string::operator=((string *)src,(string *)local_110);
      if (local_110 != (undefined1  [8])local_100) {
        operator_delete((void *)local_110);
      }
      *(undefined1 *)&src[4].data_ = 1;
      break;
    case 2:
      bVar1 = GetVarint64(&local_58,(uint64_t *)local_158);
      if (!bVar1) {
        local_40.data_ = "log number";
        goto LAB_00113a77;
      }
      *(undefined1 *)((long)&src[4].data_ + 1) = 1;
      break;
    case 3:
      bVar1 = GetVarint64(&local_58,(uint64_t *)local_168);
      if (!bVar1) {
        local_40.data_ = "next file number";
        goto LAB_00113a77;
      }
      *(undefined1 *)((long)&src[4].data_ + 3) = 1;
      break;
    case 4:
      bVar1 = GetVarint64(&local_58,local_160);
      if (!bVar1) {
        local_40.data_ = "last sequence number";
        goto LAB_00113a77;
      }
      *(undefined1 *)((long)&src[4].data_ + 4) = 1;
      break;
    case 5:
      bVar1 = GetVarint32(&local_58,(uint32_t *)local_110);
      if (bVar1 && (uint)local_110._0_4_ < 7) {
        local_198 = local_110._0_4_;
        bVar1 = GetInternalKey(&local_58,&local_148);
        if (bVar1) {
          local_110._0_4_ = local_198;
          local_108 = local_f8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_108,local_148.rep_._M_dataplus._M_p,
                     local_148.rep_._M_dataplus._M_p + local_148.rep_._M_string_length);
          std::
          vector<std::pair<int,leveldb::InternalKey>,std::allocator<std::pair<int,leveldb::InternalKey>>>
          ::emplace_back<std::pair<int,leveldb::InternalKey>>
                    (local_180,(pair<int,_leveldb::InternalKey> *)local_110);
          pcVar2 = local_f8;
          _Var4._M_p = local_108;
LAB_001139d5:
          if (_Var4._M_p != pcVar2) {
            operator_delete(_Var4._M_p);
          }
          break;
        }
      }
      local_40.data_ = "compaction pointer";
      goto LAB_00113a77;
    case 6:
      bVar1 = GetVarint32(&local_58,(uint32_t *)local_110);
      if (bVar1 && (uint)local_110._0_4_ < 7) {
        local_198 = local_110._0_4_;
        bVar1 = GetVarint64(&local_58,(uint64_t *)&local_118);
        if (bVar1) {
          local_110._0_4_ = local_198;
          local_108 = local_118;
          std::
          _Rb_tree<std::pair<int,unsigned_long>,std::pair<int,unsigned_long>,std::_Identity<std::pair<int,unsigned_long>>,std::less<std::pair<int,unsigned_long>>,std::allocator<std::pair<int,unsigned_long>>>
          ::_M_insert_unique<std::pair<int,unsigned_long>>
                    ((_Rb_tree<std::pair<int,unsigned_long>,std::pair<int,unsigned_long>,std::_Identity<std::pair<int,unsigned_long>>,std::less<std::pair<int,unsigned_long>>,std::allocator<std::pair<int,unsigned_long>>>
                      *)local_178,(pair<int,_unsigned_long> *)local_110);
          break;
        }
      }
      local_40.data_ = "deleted file";
      goto LAB_00113a77;
    case 7:
      bVar1 = GetVarint32(&local_58,(uint32_t *)local_110);
      if (bVar1 && (uint)local_110._0_4_ < 7) {
        local_198 = local_110._0_4_;
        bVar1 = GetVarint64(&local_58,&local_b0.number);
        if ((((bVar1) && (bVar1 = GetVarint64(&local_58,&local_b0.file_size), bVar1)) &&
            (bVar1 = GetInternalKey(&local_58,&local_b0.smallest), bVar1)) &&
           (bVar1 = GetInternalKey(&local_58,&local_b0.largest), bVar1)) {
          std::pair<int,_leveldb::FileMetaData>::pair<int_&,_leveldb::FileMetaData_&,_true>
                    ((pair<int,_leveldb::FileMetaData> *)local_110,(int *)&local_198,&local_b0);
          std::
          vector<std::pair<int,leveldb::FileMetaData>,std::allocator<std::pair<int,leveldb::FileMetaData>>>
          ::emplace_back<std::pair<int,leveldb::FileMetaData>>
                    ((vector<std::pair<int,leveldb::FileMetaData>,std::allocator<std::pair<int,leveldb::FileMetaData>>>
                      *)local_188,(pair<int,_leveldb::FileMetaData> *)local_110);
          if (local_d0._M_p != local_c0) {
            operator_delete(local_d0._M_p);
          }
          pcVar2 = local_e0;
          _Var4._M_p = local_f0._M_p;
          goto LAB_001139d5;
        }
      }
      local_40.data_ = "new-file entry";
      goto LAB_00113a77;
    default:
      local_40.data_ = "unknown tag";
      goto LAB_00113a77;
    case 9:
      bVar1 = GetVarint64(&local_58,local_170);
      if (!bVar1) {
        local_40.data_ = "previous log number";
        goto LAB_00113a77;
      }
      *(undefined1 *)((long)&src[4].data_ + 2) = 1;
    }
  } while( true );
}

Assistant:

Status VersionEdit::DecodeFrom(const Slice& src) {
  Clear();
  Slice input = src;
  const char* msg = nullptr;
  uint32_t tag;

  // Temporary storage for parsing
  int level;
  uint64_t number;
  FileMetaData f;
  Slice str;
  InternalKey key;

  while (msg == nullptr && GetVarint32(&input, &tag)) {
    switch (tag) {
      case kComparator:
        if (GetLengthPrefixedSlice(&input, &str)) {
          comparator_ = str.ToString();
          has_comparator_ = true;
        } else {
          msg = "comparator name";
        }
        break;

      case kLogNumber:
        if (GetVarint64(&input, &log_number_)) {
          has_log_number_ = true;
        } else {
          msg = "log number";
        }
        break;

      case kPrevLogNumber:
        if (GetVarint64(&input, &prev_log_number_)) {
          has_prev_log_number_ = true;
        } else {
          msg = "previous log number";
        }
        break;

      case kNextFileNumber:
        if (GetVarint64(&input, &next_file_number_)) {
          has_next_file_number_ = true;
        } else {
          msg = "next file number";
        }
        break;

      case kLastSequence:
        if (GetVarint64(&input, &last_sequence_)) {
          has_last_sequence_ = true;
        } else {
          msg = "last sequence number";
        }
        break;

      case kCompactPointer:
        if (GetLevel(&input, &level) && GetInternalKey(&input, &key)) {
          compact_pointers_.push_back(std::make_pair(level, key));
        } else {
          msg = "compaction pointer";
        }
        break;

      case kDeletedFile:
        if (GetLevel(&input, &level) && GetVarint64(&input, &number)) {
          deleted_files_.insert(std::make_pair(level, number));
        } else {
          msg = "deleted file";
        }
        break;

      case kNewFile:
        if (GetLevel(&input, &level) && GetVarint64(&input, &f.number) &&
            GetVarint64(&input, &f.file_size) &&
            GetInternalKey(&input, &f.smallest) &&
            GetInternalKey(&input, &f.largest)) {
          new_files_.push_back(std::make_pair(level, f));
        } else {
          msg = "new-file entry";
        }
        break;

      default:
        msg = "unknown tag";
        break;
    }
  }

  if (msg == nullptr && !input.empty()) {
    msg = "invalid tag";
  }

  Status result;
  if (msg != nullptr) {
    result = Status::Corruption("VersionEdit", msg);
  }
  return result;
}